

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O1

void __thiscall
CompilationContext::offsetToLineAndCol(CompilationContext *this,int offset,int *line,int *col)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  *line = 1;
  *col = 1;
  bVar2 = is_utf8_bom((this->code)._M_dataplus._M_p,0);
  iVar4 = (uint)bVar2 + (uint)bVar2 * 2;
  iVar3 = (int)(this->code)._M_string_length;
  if (offset < iVar3) {
    iVar3 = offset;
  }
  if (iVar4 < iVar3) {
    pcVar1 = (this->code)._M_dataplus._M_p;
    do {
      *col = *col + 1;
      if ((pcVar1[iVar4] == '\r') && (pcVar1[(long)iVar4 + 1] == '\n')) {
        iVar4 = iVar4 + 1;
      }
      if ((pcVar1[iVar4] == '\r') || (pcVar1[iVar4] == '\n')) {
        *line = *line + 1;
        *col = 1;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < iVar3);
  }
  return;
}

Assistant:

void CompilationContext::offsetToLineAndCol(int offset, int & line, int & col) const
{
  line = 1;
  col = 1;
  int start = is_utf8_bom(code.c_str(), 0) ? 3 : 0;

  for (int i = start; i < int(code.length()); i++)
  {
    if (offset - 1 < i)
      break;

    col++;

    if (code[i] == 0x0d && code[i + 1] == 0x0a)
      i++;

    if (code[i] == 0x0d || code[i] == 0x0a)
    {
      line++;
      col = 1;
    }
  }
}